

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O3

int minimalInitialFlip(word *pInOut,int nVars,uint *p_uCanonPhase)

{
  word wVar1;
  int iVar2;
  
  iVar2 = Kit_TruthWordNum_64bit(nVars);
  wVar1 = pInOut[(long)iVar2 + -1];
  if ((long)wVar1 < 0) {
    Kit_TruthNot_64bit(pInOut,nVars);
    *p_uCanonPhase = *p_uCanonPhase ^ 1 << ((byte)nVars & 0x1f);
  }
  return (uint)((long)wVar1 < 0);
}

Assistant:

int minimalInitialFlip(word* pInOut, int  nVars, unsigned* p_uCanonPhase)
{
    word oneWord=1;
    if(  (pInOut[Kit_TruthWordNum_64bit( nVars ) -1]>>63) & oneWord )
    {
        Kit_TruthNot_64bit( pInOut, nVars );
        *p_uCanonPhase ^= (1 << nVars);
        return 1;
    }
    return 0;
}